

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseTableConstructor(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  long in_RSI;
  tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> in_RDI;
  ParserImpl *in_stack_00000048;
  unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> table;
  pointer in_stack_ffffffffffffff48;
  ParserImpl *in_stack_ffffffffffffff50;
  unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> *in_stack_ffffffffffffff58;
  TokenDetail *in_stack_ffffffffffffff60;
  TokenDetail *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  ParseException *in_stack_ffffffffffffffd0;
  ParserImpl *in_stack_ffffffffffffffe8;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> this_00;
  
  this_00._M_head_impl =
       (SyntaxTree *)
       in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  NextToken(in_stack_ffffffffffffff50);
  if (*(int *)(in_RSI + 0x20) != 0x7b) {
    __assert_fail("current_.token_ == \'{\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x2f6,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableConstructor()"
                 );
  }
  operator_new(0x28);
  luna::TableDefine::TableDefine
            ((TableDefine *)in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  std::unique_ptr<luna::TableDefine,std::default_delete<luna::TableDefine>>::
  unique_ptr<std::default_delete<luna::TableDefine>,void>
            ((unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  do {
    pTVar1 = LookAhead(in_stack_ffffffffffffff50);
    if (pTVar1->token_ == 0x7d) {
      pTVar1 = NextToken(in_stack_ffffffffffffff50);
      if (pTVar1->token_ == 0x7d) {
        std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
        unique_ptr<luna::TableDefine,std::default_delete<luna::TableDefine>,void>
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_>::~unique_ptr
                  ((unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> *)pTVar1)
        ;
        return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
               )(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                 )in_RDI.
                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    pTVar1 = LookAhead(in_stack_ffffffffffffff50);
    if (pTVar1->token_ == 0x5b) {
      std::unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_>::operator->
                ((unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> *)0x1d7de5)
      ;
      ParseTableIndexField(in_stack_00000048);
      std::
      vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
      ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                   *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff60);
    }
    else {
      pTVar1 = LookAhead(in_stack_ffffffffffffff50);
      if ((pTVar1->token_ == 0x115) &&
         (pTVar1 = LookAhead2(in_stack_ffffffffffffff50), pTVar1->token_ == 0x3d)) {
        std::unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_>::operator->
                  ((unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> *)
                   0x1d7ed6);
        ParseTableNameField((ParserImpl *)this_00._M_head_impl);
        std::
        vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
        ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                     *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff60);
      }
      else {
        std::unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_>::operator->
                  ((unique_ptr<luna::TableDefine,_std::default_delete<luna::TableDefine>_> *)
                   0x1d7f4c);
        ParseTableArrayField(in_stack_ffffffffffffffe8);
        std::
        vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
        ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                     *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff60);
      }
    }
    in_stack_ffffffffffffff60 = LookAhead(in_stack_ffffffffffffff50);
  } while (((in_stack_ffffffffffffff60->token_ == 0x7d) ||
           (NextToken(in_stack_ffffffffffffff50), *(int *)(in_RSI + 0x20) == 0x2c)) ||
          (*(int *)(in_RSI + 0x20) == 0x3b));
  uVar2 = __cxa_allocate_exception(0x20);
  luna::ParseException::ParseException
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableConstructor()
        {
            NextToken();
            assert(current_.token_ == '{');

            std::unique_ptr<TableDefine> table(new TableDefine(current_.line_));

            while (LookAhead().token_ != '}')
            {
                if (LookAhead().token_ == '[')
                    table->fields_.push_back(ParseTableIndexField());
                else if (LookAhead().token_ == Token_Id && LookAhead2().token_ == '=')
                    table->fields_.push_back(ParseTableNameField());
                else
                    table->fields_.push_back(ParseTableArrayField());

                if (LookAhead().token_ != '}')
                {
                    NextToken();
                    if (current_.token_ != ',' && current_.token_ != ';')
                        throw ParseException("expect ',' or ';' to split table fields", current_);
                }
            }

            if (NextToken().token_ != '}')
                throw ParseException("expect '}' for table", current_);
            return std::move(table);
        }